

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistanceGraph.cc
# Opt level: O0

vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_> * __thiscall
DistanceGraph::find_all_paths_between
          (DistanceGraph *this,sgNodeID_t from,sgNodeID_t to,int64_t max_size,int max_nodes,
          bool abort_on_loops)

{
  sgNodeID_t sVar1;
  bool bVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  reference pLVar6;
  reference pvVar7;
  long lVar8;
  ostream *poVar9;
  size_type sVar10;
  long in_RCX;
  long lVar11;
  long in_RDX;
  long *in_RSI;
  vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_> *in_RDI;
  ulong in_R8;
  int in_R9D;
  byte in_stack_00000008;
  bool early_exit;
  uint64_t new_size;
  int i2;
  int i1;
  uint64_t ei;
  Link *fl_1;
  iterator __end2;
  iterator __begin2;
  vector<Link,_std::allocator<Link>_> *__range2;
  vector<Link,_std::allocator<Link>_> fwl;
  value_type current_entry;
  uint64_t current_index;
  Link *fl;
  iterator __end1;
  iterator __begin1;
  vector<Link,_std::allocator<Link>_> *__range1;
  vector<long,_std::allocator<long>_> pp;
  vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_> final_paths;
  vector<T,_std::allocator<T>_> node_entries;
  ostream *in_stack_fffffffffffffdb8;
  ostream *in_stack_fffffffffffffdc0;
  SequenceDistanceGraph *in_stack_fffffffffffffdc8;
  ostream *in_stack_fffffffffffffdd0;
  unsigned_long *in_stack_fffffffffffffdd8;
  vector<T,_std::allocator<T>_> *in_stack_fffffffffffffde0;
  size_type in_stack_fffffffffffffde8;
  vector<T,_std::allocator<T>_> *in_stack_fffffffffffffdf0;
  sgNodeID_t in_stack_fffffffffffffe20;
  DistanceGraph *in_stack_fffffffffffffe28;
  int local_140;
  int local_13c;
  size_type local_138;
  __normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_> local_120;
  undefined1 *local_118;
  undefined1 local_110 [24];
  int64_t local_f8;
  sgNodeID_t sStack_f0;
  undefined8 local_e8;
  int64_t iStack_e0;
  ulong local_d8;
  undefined8 local_d0;
  undefined4 local_c8;
  undefined4 local_c4;
  reference local_c0;
  Link *local_b8;
  __normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_> local_b0;
  undefined1 local_a8 [24];
  undefined1 *local_90;
  vector<long,_std::allocator<long>_> local_88;
  vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_> local_70;
  vector<T,_std::allocator<T>_> local_48;
  byte local_2d;
  int local_2c;
  ulong local_28;
  long local_20;
  long local_18;
  
  local_2d = in_stack_00000008 & 1;
  local_2c = in_R9D;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::vector<T,_std::allocator<T>_>::vector((vector<T,_std::allocator<T>_> *)0x3903cf);
  std::vector<T,_std::allocator<T>_>::reserve(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>::vector
            ((vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_> *)
             0x3903f0);
  std::vector<long,_std::allocator<long>_>::vector((vector<long,_std::allocator<long>_> *)0x3903fd);
  get_fw_links(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  local_90 = local_a8;
  local_b0._M_current =
       (Link *)std::vector<Link,_std::allocator<Link>_>::begin
                         ((vector<Link,_std::allocator<Link>_> *)in_stack_fffffffffffffdb8);
  local_b8 = (Link *)std::vector<Link,_std::allocator<Link>_>::end
                               ((vector<Link,_std::allocator<Link>_> *)in_stack_fffffffffffffdb8);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_> *)
                            in_stack_fffffffffffffdc0,
                            (__normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_> *)
                            in_stack_fffffffffffffdb8), bVar2) {
    local_c0 = __gnu_cxx::__normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_>::
               operator*(&local_b0);
    if ((local_c0->dest == local_20) &&
       (bVar2 = std::vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>::
                empty((vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
                       *)in_stack_fffffffffffffdd0), bVar2)) {
      std::vector<SequenceDistanceGraphPath,std::allocator<SequenceDistanceGraphPath>>::
      emplace_back<SequenceDistanceGraph&,std::vector<long,std::allocator<long>>&>
                ((vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_> *)
                 in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                 (vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffdc0);
    }
    else {
      sVar4 = local_c0->dest;
      if ((long)sVar4 < 1) {
        sVar4 = -sVar4;
      }
      std::vector<Node,_std::allocator<Node>_>::operator[]
                ((vector<Node,_std::allocator<Node>_> *)(*in_RSI + 0x40),sVar4);
      uVar3 = std::__cxx11::string::size();
      if (uVar3 <= local_28) {
        local_c4 = 0xffffffff;
        local_c8 = 1;
        sVar4 = local_c0->dest;
        if ((long)sVar4 < 1) {
          sVar4 = -sVar4;
        }
        std::vector<Node,_std::allocator<Node>_>::operator[]
                  ((vector<Node,_std::allocator<Node>_> *)(*in_RSI + 0x40),sVar4);
        local_d0 = std::__cxx11::string::size();
        std::
        vector<DistanceGraph::find_all_paths_between(long,long,long,int,bool)const::T,std::allocator<DistanceGraph::find_all_paths_between(long,long,long,int,bool)const::T>>
        ::emplace_back<int,long&,int,unsigned_long>
                  (in_stack_fffffffffffffde0,(int *)in_stack_fffffffffffffdd8,
                   (long *)in_stack_fffffffffffffdd0,(int *)in_stack_fffffffffffffdc8,
                   (unsigned_long *)in_stack_fffffffffffffdc0);
      }
    }
    __gnu_cxx::__normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_>::operator++
              (&local_b0);
  }
  std::vector<Link,_std::allocator<Link>_>::~vector
            ((vector<Link,_std::allocator<Link>_> *)in_stack_fffffffffffffdd0);
  local_d8 = 0;
  while( true ) {
    uVar3 = local_d8;
    sVar4 = std::vector<T,_std::allocator<T>_>::size(&local_48);
    bVar2 = false;
    if (uVar3 < sVar4) {
      sVar4 = std::vector<T,_std::allocator<T>_>::size(&local_48);
      bVar2 = false;
      if (sVar4 < 0xf4241) {
        sVar4 = std::vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>::
                size(&local_70);
        bVar2 = sVar4 < 0x3e9;
      }
    }
    if (!bVar2) break;
    pvVar5 = std::vector<T,_std::allocator<T>_>::operator[](&local_48,local_d8);
    local_f8 = pvVar5->prev;
    sStack_f0 = pvVar5->node;
    local_e8 = *(undefined8 *)&pvVar5->node_count;
    iStack_e0 = pvVar5->partial_size;
    get_fw_links(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    local_118 = local_110;
    local_120._M_current =
         (Link *)std::vector<Link,_std::allocator<Link>_>::begin
                           ((vector<Link,_std::allocator<Link>_> *)in_stack_fffffffffffffdb8);
    std::vector<Link,_std::allocator<Link>_>::end
              ((vector<Link,_std::allocator<Link>_> *)in_stack_fffffffffffffdb8);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_>
                               *)in_stack_fffffffffffffdc0,
                              (__normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_>
                               *)in_stack_fffffffffffffdb8), bVar2) {
      pLVar6 = __gnu_cxx::__normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_>::
               operator*(&local_120);
      if (pLVar6->dest == local_20) {
        std::vector<long,_std::allocator<long>_>::resize
                  ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffde0,
                   (size_type)in_stack_fffffffffffffdd8);
        local_138 = local_d8;
        while (local_138 != 0xffffffffffffffff) {
          pvVar5 = std::vector<T,_std::allocator<T>_>::operator[](&local_48,local_138);
          sVar1 = pvVar5->node;
          pvVar5 = std::vector<T,_std::allocator<T>_>::operator[](&local_48,local_138);
          pvVar7 = std::vector<long,_std::allocator<long>_>::operator[]
                             (&local_88,(long)(pvVar5->node_count + -1));
          *pvVar7 = sVar1;
          pvVar5 = std::vector<T,_std::allocator<T>_>::operator[](&local_48,local_138);
          local_138 = pvVar5->prev;
        }
        if ((local_2d & 1) != 0) {
          for (local_13c = 0; sVar4 = std::vector<long,_std::allocator<long>_>::size(&local_88),
              (ulong)(long)local_13c < sVar4; local_13c = local_13c + 1) {
            for (local_140 = 0; sVar4 = std::vector<long,_std::allocator<long>_>::size(&local_88),
                (ulong)(long)local_140 < sVar4; local_140 = local_140 + 1) {
              pvVar7 = std::vector<long,_std::allocator<long>_>::operator[]
                                 (&local_88,(long)local_13c);
              lVar11 = *pvVar7;
              pvVar7 = std::vector<long,_std::allocator<long>_>::operator[]
                                 (&local_88,(long)local_140);
              if (lVar11 == *pvVar7) {
                memset(in_RDI,0,0x18);
                std::vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>::
                vector((vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
                        *)0x390950);
                bVar2 = true;
                goto LAB_00390aa8;
              }
            }
          }
        }
        std::vector<SequenceDistanceGraphPath,std::allocator<SequenceDistanceGraphPath>>::
        emplace_back<SequenceDistanceGraph&,std::vector<long,std::allocator<long>>&>
                  ((vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_> *)
                   in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                   (vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffdc0);
      }
      else {
        lVar11 = iStack_e0 + pLVar6->dist;
        sVar4 = pLVar6->dest;
        if ((long)sVar4 < 1) {
          sVar4 = -sVar4;
        }
        std::vector<Node,_std::allocator<Node>_>::operator[]
                  ((vector<Node,_std::allocator<Node>_> *)(*in_RSI + 0x40),sVar4);
        lVar8 = std::__cxx11::string::size();
        if (((ulong)(lVar11 + lVar8) <= local_28) && ((int)local_e8 <= local_2c)) {
          std::
          vector<DistanceGraph::find_all_paths_between(long,long,long,int,bool)const::T,std::allocator<DistanceGraph::find_all_paths_between(long,long,long,int,bool)const::T>>
          ::emplace_back<unsigned_long&,long&,int,unsigned_long&>
                    (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                     (long *)in_stack_fffffffffffffdd0,(int *)in_stack_fffffffffffffdc8,
                     (unsigned_long *)in_stack_fffffffffffffdc0);
        }
      }
      __gnu_cxx::__normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_>::operator++
                (&local_120);
    }
    bVar2 = false;
LAB_00390aa8:
    std::vector<Link,_std::allocator<Link>_>::~vector
              ((vector<Link,_std::allocator<Link>_> *)in_stack_fffffffffffffdd0);
    if (bVar2) goto LAB_00390d6d;
    local_d8 = local_d8 + 1;
  }
  sVar4 = std::vector<T,_std::allocator<T>_>::size(&local_48);
  if (sVar4 == 1000000) {
    poVar9 = std::operator<<((ostream *)&std::cout,"From ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_18);
    poVar9 = std::operator<<(poVar9," to ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_20);
    poVar9 = std::operator<<(poVar9," with max_size ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_28);
    poVar9 = std::operator<<(poVar9," and max_nodes ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_2c);
    poVar9 = std::operator<<(poVar9," there were too many nodes!");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  }
  sVar10 = std::vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>::size
                     (&local_70);
  if (sVar10 == 1000) {
    poVar9 = std::operator<<((ostream *)&std::cout,"From ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_18);
    poVar9 = std::operator<<(poVar9," to ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_20);
    poVar9 = std::operator<<(poVar9," with max_size ");
    in_stack_fffffffffffffdd0 = (ostream *)std::ostream::operator<<(poVar9,local_28);
    poVar9 = std::operator<<(in_stack_fffffffffffffdd0," and max_nodes ");
    in_stack_fffffffffffffdc0 = (ostream *)std::ostream::operator<<(poVar9,local_2c);
    in_stack_fffffffffffffdb8 =
         std::operator<<(in_stack_fffffffffffffdc0," there were too many paths!");
    std::ostream::operator<<(in_stack_fffffffffffffdb8,std::endl<char,std::char_traits<char>>);
  }
  if (sVar10 == 1000 || sVar4 == 1000000) {
    memset(in_RDI,0,0x18);
    std::vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>::vector
              ((vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_> *)
               0x390d40);
  }
  else {
    std::vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>::vector
              ((vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_> *)
               in_stack_fffffffffffffdc0,
               (vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_> *)
               in_stack_fffffffffffffdb8);
  }
LAB_00390d6d:
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffdd0);
  std::vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>::~vector
            ((vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_> *)
             in_stack_fffffffffffffdd0);
  std::vector<T,_std::allocator<T>_>::~vector
            ((vector<T,_std::allocator<T>_> *)in_stack_fffffffffffffdd0);
  return in_RDI;
}

Assistant:

std::vector<SequenceDistanceGraphPath> DistanceGraph::find_all_paths_between(sgNodeID_t from,sgNodeID_t to, int64_t max_size, int max_nodes, bool abort_on_loops) const {
    typedef struct T {
        int64_t prev;
        sgNodeID_t node;
        int node_count;
        int64_t partial_size;
        T(uint64_t a, sgNodeID_t b, int c, int64_t d) : prev(a),node(b),node_count(c),partial_size(d){};
    } pathNodeEntry_t;

    std::vector<pathNodeEntry_t> node_entries;
    node_entries.reserve(100000);
    std::vector<SequenceDistanceGraphPath> final_paths;
    std::vector<sgNodeID_t> pp;

    for(auto &fl:get_fw_links(from)) {
        if (fl.dest==to and final_paths.empty()) {
            final_paths.emplace_back(sdg,pp);
        }
        else if (sdg.nodes[llabs(fl.dest)].sequence.size()<=max_size) {
            node_entries.emplace_back(-1, fl.dest, 1, sdg.nodes[llabs(fl.dest)].sequence.size());
        }
    }


    // XXX: This loop is growing forever on node 2083801 for backbone 58, the limits are heuristics to cap the complexity of regions captured
    for (uint64_t current_index=0;current_index<node_entries.size() and node_entries.size() < 1000001 and final_paths.size() < 1001;++current_index){
        auto current_entry=node_entries[current_index];
        auto fwl=get_fw_links(current_entry.node);
        for(auto &fl:fwl) {
            if (fl.dest==to){
                //reconstruct path backwards
                pp.resize(current_entry.node_count);

                for (uint64_t ei=current_index;ei!=-1;ei=node_entries[ei].prev){
                    pp[node_entries[ei].node_count-1]=node_entries[ei].node;
                }
                //check if there are any loops
                if (abort_on_loops) {
                    for (auto i1 = 0; i1 < pp.size(); ++i1) {
                        for (auto i2 = 0; i2 < pp.size(); ++i2) {
                            if (pp[i1]==pp[i2]) {
                                return {};
                            }
                        }
                    }
                }
                //add to solutions
                final_paths.emplace_back(sdg,pp);
            }
            else {
                uint64_t new_size=current_entry.partial_size+fl.dist+sdg.nodes[llabs(fl.dest)].sequence.size();
                if (new_size<=max_size and current_entry.node_count<=max_nodes) {
                    node_entries.emplace_back(current_index, fl.dest, current_entry.node_count+1, new_size);
                }
            }
        }

    }

    bool early_exit=false;
    if (node_entries.size() == 1000000) {
        std::cout << "From " << from << " to " << to << " with max_size " << max_size << " and max_nodes " << max_nodes << " there were too many nodes!"<< std::endl;
        early_exit = true;
    }

    if (final_paths.size() == 1000) {
        std::cout << "From " << from << " to " << to << " with max_size " << max_size << " and max_nodes " << max_nodes << " there were too many paths!"<< std::endl;
        early_exit = true;
    }

    if (early_exit) return {};
    return final_paths;
}